

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decPrint.c
# Opt level: O2

void Dec_GraphPrint(FILE *pFile,Dec_Graph_t *pGraph,char **pNamesIn,char *pNameOut)

{
  Dec_Edge_t DVar1;
  ulong uVar2;
  uint uVar3;
  char *pNameOut_00;
  ulong uVar4;
  int in_stack_ffffffffffffffb8;
  int local_3c;
  Vec_Ptr_t *local_38;
  
  uVar4 = 0;
  if (pNamesIn == (char **)0x0) {
    local_38 = Abc_NodeGetFakeNames(pGraph->nLeaves);
    pNamesIn = (char **)local_38->pArray;
  }
  else {
    local_38 = (Vec_Ptr_t *)0x0;
  }
  uVar3 = pGraph->nLeaves;
  uVar2 = 0;
  if (0 < (int)uVar3) {
    uVar2 = (ulong)uVar3;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
  }
  pNameOut_00 = "F";
  if (pNameOut != (char *)0x0) {
    pNameOut_00 = pNameOut;
  }
  if (pGraph->fConst == 0) {
    DVar1 = pGraph->eRoot;
    local_3c = Dec_GraphPrintOutputName(pFile,pNameOut_00);
    if (((uint)DVar1 >> 1 & 0x3fffffff) < uVar3) {
      uVar3 = (uint)pGraph->eRoot >> 1 & 0x3fffffff;
      if ((uint)pGraph->nLeaves <= uVar3) {
        __assert_fail("Dec_GraphIsVar( pGraph )",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/dec/dec.h"
                      ,0x218,"int Dec_GraphVarInt(Dec_Graph_t *)");
      }
      Dec_GraphPrintGetLeafName(pFile,uVar3,(uint)pGraph->eRoot & 1,pNamesIn);
    }
    else {
      Dec_GraphPrint_rec(pFile,pGraph,pGraph->pNodes + (long)pGraph->nSize + -1,
                         (uint)pGraph->eRoot & 1,pNamesIn,&local_3c,in_stack_ffffffffffffffb8);
    }
  }
  else {
    local_3c = Dec_GraphPrintOutputName(pFile,pNameOut_00);
    fprintf((FILE *)pFile,"Constant %d",(ulong)(~(uint)pGraph->eRoot & 1));
  }
  fputc(10,(FILE *)pFile);
  if (local_38 != (Vec_Ptr_t *)0x0) {
    Abc_NodeFreeNames(local_38);
  }
  return;
}

Assistant:

void Dec_GraphPrint( FILE * pFile, Dec_Graph_t * pGraph, char * pNamesIn[], char * pNameOut )
{
    Vec_Ptr_t * vNamesIn = NULL;
    int LitSizeMax, LitSizeCur, Pos, i;

    // create the names if not given by the user
    if ( pNamesIn == NULL )
    {
        vNamesIn = Abc_NodeGetFakeNames( Dec_GraphLeaveNum(pGraph) );
        pNamesIn = (char **)vNamesIn->pArray;
    }
    if ( pNameOut == NULL )
        pNameOut = "F";

    // get the size of the longest literal
    LitSizeMax = 0;
    for ( i = 0; i < Dec_GraphLeaveNum(pGraph); i++ )
    {
        LitSizeCur = strlen(pNamesIn[i]);
        if ( LitSizeMax < LitSizeCur )
            LitSizeMax = LitSizeCur;
    }
    if ( LitSizeMax > 50 )
        LitSizeMax = 20;

    // write the decomposition graph (factored form)
    if ( Dec_GraphIsConst(pGraph) ) // constant
    {
        Pos = Dec_GraphPrintOutputName( pFile, pNameOut );
        fprintf( pFile, "Constant %d", !Dec_GraphIsComplement(pGraph) );
    }
    else if ( Dec_GraphIsVar(pGraph) ) // literal
    {
        Pos = Dec_GraphPrintOutputName( pFile, pNameOut );
        Dec_GraphPrintGetLeafName( pFile, Dec_GraphVarInt(pGraph), Dec_GraphIsComplement(pGraph), pNamesIn );
    }
    else
    {
        Pos = Dec_GraphPrintOutputName( pFile, pNameOut );
        Dec_GraphPrint_rec( pFile, pGraph, Dec_GraphNodeLast(pGraph), Dec_GraphIsComplement(pGraph), pNamesIn, &Pos, LitSizeMax );
    }
    fprintf( pFile, "\n" );

    if ( vNamesIn )
        Abc_NodeFreeNames( vNamesIn );
}